

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sturm.cpp
# Opt level: O2

int numchanges(int np,poly *sseq,double a)

{
  poly *ppVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = evalpoly(sseq->ord,sseq->coef,a);
  iVar2 = 0;
  for (ppVar1 = sseq + 1; ppVar1 <= sseq + np; ppVar1 = ppVar1 + 1) {
    dVar4 = evalpoly(ppVar1->ord,ppVar1->coef,a);
    iVar2 = iVar2 + (uint)(dVar3 == 0.0 || dVar4 * dVar3 < 0.0);
    dVar3 = dVar4;
  }
  return iVar2;
}

Assistant:

int numchanges(int np, poly *sseq, double a)
   {
   int changes = 0;

   double lf = evalpoly(sseq[0].ord, sseq[0].coef, a);

   poly *s;
   for (s = sseq + 1; s <= sseq + np; s++) {
      double f = evalpoly(s->ord, s->coef, a);
      if (lf == 0.0 || lf * f < 0)
         changes++;
      lf = f;
      }

   return(changes);
   }